

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall toml::internal::Lexer::nextKey(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char c;
  allocator local_69;
  string s;
  string local_48;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = current(this,&c);
    cVar1 = c;
    if (!bVar2) break;
    iVar3 = isalnum((int)c);
    if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '-')) break;
    std::__cxx11::string::push_back((char)&s);
    next(this);
  }
  if (s._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_48,"Unknown key format",&local_69);
    Token::Token(__return_storage_ptr__,ERROR_TOKEN,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    Token::Token(__return_storage_ptr__,IDENT,&s);
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::nextKey()
{
    std::string s;
    char c;
    while (current(&c) && (isalnum(c) || c == '_' || c == '-')) {
        s += c;
        next();
    }

    if (s.empty())
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown key format"));

    return Token(TokenType::IDENT, s);
}